

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Const::add_sink(Const *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  int iVar1;
  IRNodeKind IVar2;
  element_type *this_00;
  Var **ppVVar3;
  undefined4 extraout_var;
  IRNode *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar4 [16];
  string_view format_str;
  format_args args;
  Generator *local_158;
  Generator *gen;
  IRNode *parent;
  element_type *local_f8;
  element_type **local_f0;
  size_type local_e8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_e0;
  string local_b8;
  long *local_98;
  Generator *generator;
  Var *left;
  shared_ptr<kratos::AssignStmt> *stmt_local;
  Const *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_70;
  basic_string_view<char> local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *vargs;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  left = (Var *)stmt;
  stmt_local = (shared_ptr<kratos::AssignStmt> *)this;
  this_00 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)stmt);
  ppVVar3 = AssignStmt::left(this_00);
  generator = (Generator *)*ppVVar3;
  iVar1 = (*(generator->super_IRNode)._vptr_IRNode[0xd])();
  local_98 = (long *)CONCAT44(extraout_var,iVar1);
  if (local_98 == (long *)0x0) {
    parent._6_1_ = 1;
    auVar4 = __cxa_allocate_exception(0x10);
    local_38 = &local_b8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)anon_var_dwarf_19997f;
    local_58.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<,char[40],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)"Unable to find left hand side generator",(v7 *)stmt,auVar4._8_8_);
    local_48 = &local_58;
    local_68 = fmt::v7::to_string_view<char,_0>((char *)vargs);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_48;
    local_20 = local_48;
    local_10 = local_48;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_48->string);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_68.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_70.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_68.data_,format_str,args);
    local_f8 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)left);
    local_f0 = &local_f8;
    local_e8 = 1;
    std::allocator<kratos::IRNode_*>::allocator((allocator<kratos::IRNode_*> *)((long)&parent + 7));
    __l._M_len = local_e8;
    __l._M_array = (iterator)local_f0;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_e0,__l,(allocator<kratos::IRNode_*> *)((long)&parent + 7));
    StmtException::StmtException(auVar4._0_8_,&local_b8,&local_e0);
    parent._6_1_ = 0;
    __cxa_throw(auVar4._0_8_,&StmtException::typeinfo,StmtException::~StmtException);
  }
  this_01 = (IRNode *)(**(code **)(*local_98 + 0x20))();
  if (this_01 != (IRNode *)0x0) {
    IVar2 = IRNode::ir_node_kind(this_01);
    if (IVar2 == GeneratorKind) {
      if (this_01 == (IRNode *)0x0) {
        local_158 = (Generator *)0x0;
      }
      else {
        local_158 = (Generator *)__dynamic_cast(this_01,&IRNode::typeinfo,&Generator::typeinfo,0);
      }
      (this->super_Var).generator_ = local_158;
    }
  }
  return;
}

Assistant:

void Const::add_sink(const std::shared_ptr<AssignStmt> &stmt) {
    auto *left = stmt->left();
    // if it's a port, we change the constant's generator to that of port
    auto *generator = left->generator();
    if (!generator)
        throw StmtException(::format("Unable to find left hand side generator"), {stmt.get()});
    auto *parent = generator->parent();
    if (parent && parent->ir_node_kind() == GeneratorKind) {
        auto *gen = dynamic_cast<Generator *>(parent);
        this->generator_ = gen;
    }
}